

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evolution_v2_generated.h
# Opt level: O1

bool __thiscall Evolution::V2::TableA::Verify(TableA *this,Verifier *verifier)

{
  bool bVar1;
  ushort uVar2;
  String *str;
  
  bVar1 = flatbuffers::VerifierTemplate<false>::VerifyTableStart(verifier,(uint8_t *)this);
  if ((((bVar1) &&
       (bVar1 = flatbuffers::Table::VerifyField<float>(&this->super_Table,verifier,4,4), bVar1)) &&
      (bVar1 = flatbuffers::Table::VerifyField<int>(&this->super_Table,verifier,6,4), bVar1)) &&
     (bVar1 = flatbuffers::Table::VerifyOffset<unsigned_int>(&this->super_Table,verifier,8), bVar1))
  {
    if (*(ushort *)(this + -(long)*(int *)this) < 9) {
      uVar2 = 0;
    }
    else {
      uVar2 = *(ushort *)(this + (8 - (long)*(int *)this));
    }
    if (uVar2 == 0) {
      str = (String *)0x0;
    }
    else {
      str = (String *)(this + (ulong)*(uint *)(this + uVar2) + (ulong)uVar2);
    }
    bVar1 = flatbuffers::VerifierTemplate<false>::VerifyString(verifier,str);
    if (bVar1) {
      verifier->depth_ = verifier->depth_ - 1;
      return true;
    }
  }
  return false;
}

Assistant:

bool Verify(::flatbuffers::Verifier &verifier) const {
    return VerifyTableStart(verifier) &&
           VerifyField<float>(verifier, VT_A, 4) &&
           VerifyField<int32_t>(verifier, VT_B, 4) &&
           VerifyOffset(verifier, VT_C) &&
           verifier.VerifyString(c()) &&
           verifier.EndTable();
  }